

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ScratchMalloc(int n)

{
  int N;
  ScratchFreeslot *local_18;
  void *p;
  int n_local;
  
  sqlite3_mutex_enter(mem0.mutex);
  sqlite3StatusHighwater(8,n);
  if ((mem0.nScratchFree == 0) || (sqlite3Config.szScratch < n)) {
    sqlite3_mutex_leave(mem0.mutex);
    local_18 = (ScratchFreeslot *)sqlite3Malloc((long)n);
    if ((sqlite3Config.bMemstat != 0) && (local_18 != (ScratchFreeslot *)0x0)) {
      sqlite3_mutex_enter(mem0.mutex);
      N = sqlite3MallocSize(local_18);
      sqlite3StatusUp(4,N);
      sqlite3_mutex_leave(mem0.mutex);
    }
  }
  else {
    local_18 = mem0.pScratchFree;
    mem0.pScratchFree = (mem0.pScratchFree)->pNext;
    mem0.nScratchFree = mem0.nScratchFree - 1;
    sqlite3StatusUp(3,1);
    sqlite3_mutex_leave(mem0.mutex);
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ScratchMalloc(int n){
  void *p;
  assert( n>0 );

  sqlite3_mutex_enter(mem0.mutex);
  sqlite3StatusHighwater(SQLITE_STATUS_SCRATCH_SIZE, n);
  if( mem0.nScratchFree && sqlite3GlobalConfig.szScratch>=n ){
    p = mem0.pScratchFree;
    mem0.pScratchFree = mem0.pScratchFree->pNext;
    mem0.nScratchFree--;
    sqlite3StatusUp(SQLITE_STATUS_SCRATCH_USED, 1);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    sqlite3_mutex_leave(mem0.mutex);
    p = sqlite3Malloc(n);
    if( sqlite3GlobalConfig.bMemstat && p ){
      sqlite3_mutex_enter(mem0.mutex);
      sqlite3StatusUp(SQLITE_STATUS_SCRATCH_OVERFLOW, sqlite3MallocSize(p));
      sqlite3_mutex_leave(mem0.mutex);
    }
    sqlite3MemdebugSetType(p, MEMTYPE_SCRATCH);
  }
  assert( sqlite3_mutex_notheld(mem0.mutex) );


#if SQLITE_THREADSAFE==0 && !defined(NDEBUG)
  /* EVIDENCE-OF: R-12970-05880 SQLite will not use more than one scratch
  ** buffers per thread.
  **
  ** This can only be checked in single-threaded mode.
  */
  assert( scratchAllocOut==0 );
  if( p ) scratchAllocOut++;
#endif

  return p;
}